

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef::~IfcParameterizedProfileDef
          (IfcParameterizedProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcParameterizedProfileDef *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcParameterizedProfileDef,_1UL> *)
             &(this->super_IfcProfileDef).field_0x58,vtt + 5);
  IfcProfileDef::~IfcProfileDef(&this->super_IfcProfileDef,vtt + 1);
  return;
}

Assistant:

IfcParameterizedProfileDef() : Object("IfcParameterizedProfileDef") {}